

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O2

bool Reflection::get<unsigned_int>(Struct *target,string *name,uint *value,size_t offset)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  long lVar6;
  long lVar7;
  type_info *this;
  undefined4 extraout_var_02;
  
  iVar2 = (*target->_vptr_Struct[1])();
  this = (type_info *)CONCAT44(extraout_var,iVar2);
  if (this == (type_info *)0x0) {
    return false;
  }
  bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_int::typeinfo);
  if (bVar1) {
    iVar2 = (*target->_vptr_Struct[5])(target,name);
    uVar3 = *(uint *)(CONCAT44(extraout_var_00,iVar2) + offset * 4);
  }
  else {
    psVar4 = Enum::name_abi_cxx11_((type_index)0x3cf4b7);
    if (psVar4->_M_string_length == 0) {
      bVar1 = TypeInfo::is_integral(this);
      if (bVar1) {
        bVar1 = TypeInfo::is_signed(this);
        sVar5 = TypeInfo::size(this);
        if (sVar5 < 4 && !bVar1) {
          iVar2 = (*target->_vptr_Struct[5])(target,name);
          lVar6 = CONCAT44(extraout_var_02,iVar2);
          lVar7 = sVar5 * offset;
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_char::typeinfo);
          if (bVar1) {
            *value = (uint)*(byte *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&signed_char::typeinfo);
          if (bVar1) {
            *value = (int)*(char *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_short::typeinfo);
          if (bVar1) {
            *value = (uint)*(ushort *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&short::typeinfo);
          if (bVar1) {
            *value = (int)*(short *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_int::typeinfo);
          if (bVar1) {
            *value = *(uint *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&int::typeinfo);
          if (bVar1) {
            *value = *(uint *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_long::typeinfo);
          if (bVar1) {
            *value = *(uint *)(lVar6 + lVar7);
          }
          bVar1 = std::type_info::operator==(this,(type_info *)&long::typeinfo);
          if (!bVar1) {
            return true;
          }
          uVar3 = *(uint *)(lVar6 + lVar7);
          goto LAB_003cf4cd;
        }
      }
      return false;
    }
    iVar2 = (*target->_vptr_Struct[5])(target,name);
    uVar3 = *(uint *)CONCAT44(extraout_var_01,iVar2);
  }
LAB_003cf4cd:
  *value = uVar3;
  return true;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}